

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.hpp
# Opt level: O0

void print_message<char[42],__2>
               (Printer *printer,anon_class_1_0_00000001 *color,char *severity,char (*t) [42])

{
  Format<const_char_*> local_80;
  PrintTuple<char[6],_Format<const_char_*>,_char[6]> local_68;
  PrintTuple<char[5],_PrintTuple<char[6],_Format<const_char_*>,_char[6]>,_char[6]> local_48;
  char (*local_28) [42];
  char (*t_local) [42];
  char *severity_local;
  anon_class_1_0_00000001 *color_local;
  Printer *printer_local;
  
  local_28 = t;
  t_local = (char (*) [42])severity;
  severity_local = (char *)color;
  color_local = (anon_class_1_0_00000001 *)printer;
  format<char_const*>(&local_80,"%: ",(char **)&t_local);
  $_2::operator()(&local_68,(__2 *)color,&local_80);
  $_0::operator()(&local_48,(__0 *)&bold,&local_68);
  Printer::print<PrintTuple<char[5],PrintTuple<char[6],Format<char_const*>,char[6]>,char[6]>>
            (printer,&local_48);
  Printer::print((Printer *)color_local,*local_28);
  Printer::print((Printer *)color_local,'\n');
  return;
}

Assistant:

void print_message(const Printer& printer, const C& color, const char* severity, const T& t) {
	printer.print(bold(color(format("%: ", severity))));
	printer.print(t);
	printer.print('\n');
}